

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImVec2 __thiscall
ImFont::CalcTextSizeA
          (ImFont *this,float size,float max_width,float wrap_width,char *text_begin,char *text_end,
          char **remaining)

{
  float fVar1;
  bool bVar2;
  ImVec2 IVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  undefined8 *in_RCX;
  uint *in_RDX;
  uint *in_RSI;
  int *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float char_width;
  uint c;
  char *prev_s;
  char *s;
  char *word_wrap_eol;
  bool word_wrap_enabled;
  float line_width;
  float scale;
  float line_height;
  ImVec2 text_size;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff98;
  uint *puVar7;
  uint *local_58;
  uint *local_50;
  float local_44;
  uint *local_30;
  uint *puVar8;
  undefined4 in_stack_ffffffffffffffe0;
  float fVar9;
  int *piVar10;
  float in_stack_fffffffffffffff8;
  float in_stack_fffffffffffffffc;
  
  local_30 = in_RDX;
  local_58 = in_RSI;
  piVar10 = in_RDI;
  if (in_RDX == (uint *)0x0) {
    sVar6 = strlen((char *)in_RSI);
    local_30 = (uint *)((long)in_RSI + sVar6);
  }
  fVar1 = (float)in_RDI[5];
  fVar9 = in_XMM0_Da;
  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffff8,0.0,0.0);
  local_44 = 0.0;
  bVar2 = in_XMM2_Da <= 0.0;
  local_50 = (uint *)0x0;
  puVar8 = local_58;
LAB_0022e269:
  do {
    puVar7 = local_58;
    if (local_30 <= local_58) {
LAB_0022e45f:
      local_58 = puVar7;
      if (in_stack_fffffffffffffff8 < local_44) {
        in_stack_fffffffffffffff8 = local_44;
      }
      if ((0.0 < local_44) ||
         ((in_stack_fffffffffffffffc == 0.0 && (!NAN(in_stack_fffffffffffffffc))))) {
        in_stack_fffffffffffffffc = in_XMM0_Da + in_stack_fffffffffffffffc;
      }
      if (in_RCX != (undefined8 *)0x0) {
        *in_RCX = local_58;
      }
      IVar3.y = in_stack_fffffffffffffffc;
      IVar3.x = in_stack_fffffffffffffff8;
      return IVar3;
    }
    if (bVar2) {
LAB_0022e32b:
      uVar4 = (uint)(char)*local_58;
      if (uVar4 < 0x80) {
        local_58 = (uint *)((long)local_58 + 1);
      }
      else {
        iVar5 = ImTextCharFromUtf8(local_58,(char *)CONCAT44(uVar4,in_stack_ffffffffffffff98),
                                   (char *)in_RDI);
        local_58 = (uint *)((long)local_58 + (long)iVar5);
      }
      if (uVar4 < 0x20) {
        if (uVar4 == 10) {
          in_stack_fffffffffffffff8 = ImMax<float>(in_stack_fffffffffffffff8,local_44);
          in_stack_fffffffffffffffc = in_XMM0_Da + in_stack_fffffffffffffffc;
          local_44 = 0.0;
          goto LAB_0022e269;
        }
        if (uVar4 == 0xd) goto LAB_0022e269;
      }
      if ((int)uVar4 < *in_RDI) {
        in_stack_ffffffffffffff84 = *(float *)(*(long *)(in_RDI + 2) + (ulong)uVar4 * 4);
      }
      else {
        in_stack_ffffffffffffff84 = (float)in_RDI[4];
      }
      in_stack_ffffffffffffff98 = in_stack_ffffffffffffff84 * (in_XMM0_Da / fVar1);
      if (in_XMM1_Da <= local_44 + in_stack_ffffffffffffff98) goto LAB_0022e45f;
      local_44 = in_stack_ffffffffffffff98 + local_44;
      goto LAB_0022e269;
    }
    if (local_50 == (uint *)0x0) {
      local_50 = (uint *)CalcWordWrapPositionA
                                   ((ImFont *)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                    (float)((ulong)piVar10 >> 0x20),
                                    (char *)CONCAT44(fVar9,in_XMM1_Da),
                                    (char *)CONCAT44(in_XMM2_Da,in_stack_ffffffffffffffe0),
                                    (float)((ulong)puVar8 >> 0x20));
    }
    if (local_58 < local_50) goto LAB_0022e32b;
    if (in_stack_fffffffffffffff8 < local_44) {
      in_stack_fffffffffffffff8 = local_44;
    }
    in_stack_fffffffffffffffc = in_XMM0_Da + in_stack_fffffffffffffffc;
    local_44 = 0.0;
    local_50 = (uint *)0x0;
    local_58 = (uint *)CalcWordWrapNextLineStartA
                                 ((char *)CONCAT44(in_stack_ffffffffffffff84,
                                                   in_stack_ffffffffffffff80),
                                  in_stack_ffffffffffffff78);
  } while( true );
}

Assistant:

ImVec2 ImFont::CalcTextSizeA(float size, float max_width, float wrap_width, const char* text_begin, const char* text_end, const char** remaining) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // FIXME-OPT: Need to avoid this.

    const float line_height = size;
    const float scale = size / FontSize;

    ImVec2 text_size = ImVec2(0, 0);
    float line_width = 0.0f;

    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    const char* s = text_begin;
    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - line_width);

            if (s >= word_wrap_eol)
            {
                if (text_size.x < line_width)
                    text_size.x = line_width;
                text_size.y += line_height;
                line_width = 0.0f;
                word_wrap_eol = NULL;
                s = CalcWordWrapNextLineStartA(s, text_end); // Wrapping skips upcoming blanks
                continue;
            }
        }

        // Decode and advance source
        const char* prev_s = s;
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
            s += 1;
        else
            s += ImTextCharFromUtf8(&c, s, text_end);

        if (c < 32)
        {
            if (c == '\n')
            {
                text_size.x = ImMax(text_size.x, line_width);
                text_size.y += line_height;
                line_width = 0.0f;
                continue;
            }
            if (c == '\r')
                continue;
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX) * scale;
        if (line_width + char_width >= max_width)
        {
            s = prev_s;
            break;
        }

        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}